

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::Subst_Backward(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                 *this,TPZFMatrix<std::complex<long_double>_> *b)

{
  long in_RDI;
  DecomposeType dec;
  DecomposeType in_stack_00009094;
  TPZFMatrix<std::complex<long_double>_> *in_stack_00009098;
  TPZFileEqnStorage<std::complex<long_double>_> *in_stack_000090a0;
  
  std::operator<<((ostream *)&std::cout,"Entering Backward Substitution\n");
  std::ostream::flush();
  TPZFront<std::complex<long_double>_>::GetDecomposeType
            ((TPZFront<std::complex<long_double>_> *)(in_RDI + 0xd8));
  TPZFileEqnStorage<std::complex<long_double>_>::Backward
            (in_stack_000090a0,in_stack_00009098,in_stack_00009094);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Backward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Backward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Backward(*b, dec);
	return 1;
}